

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFUsedFont.cpp
# Opt level: O1

bool __thiscall
PDFUsedFont::EnumeratePaths
          (PDFUsedFont *this,IOutlineEnumerator *target,string *inText,double inFontSize)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  bool bVar3;
  UIntList glyphs;
  _List_node_base local_40;
  undefined8 local_30;
  
  local_40._M_next = &local_40;
  local_30 = 0;
  local_40._M_prev = local_40._M_next;
  GetUnicodeGlyphs(this,inText,(UIntList *)local_40._M_next);
  bVar3 = EnumeratePaths(this,target,(UIntList *)&local_40,inFontSize);
  p_Var2 = local_40._M_next;
  while (p_Var2 != &local_40) {
    p_Var1 = (((_List_base<unsigned_int,_std::allocator<unsigned_int>_> *)&p_Var2->_M_next)->_M_impl
             )._M_node.super__List_node_base._M_next;
    operator_delete(p_Var2,0x18);
    p_Var2 = p_Var1;
  }
  return bVar3;
}

Assistant:

bool PDFUsedFont::EnumeratePaths(IOutlineEnumerator& target, const std::string& inText,double inFontSize)
{
	UIntList glyphs;
	GetUnicodeGlyphs(inText, glyphs);
	return EnumeratePaths(target, glyphs,inFontSize);
}